

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

int __thiscall
ON_NurbsCurve::GetNurbForm
          (ON_NurbsCurve *this,ON_NurbsCurve *curve,double tolerance,ON_Interval *subdomain)

{
  uint uVar1;
  
  uVar1 = 1;
  (*(curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(curve,1);
  if (this != curve) {
    Internal_DeepCopyFrom(curve,this);
  }
  if (subdomain != (ON_Interval *)0x0) {
    uVar1 = (*(curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])
                      (curve,subdomain);
    uVar1 = uVar1 & 0xff;
  }
  return uVar1;
}

Assistant:

int ON_NurbsCurve::GetNurbForm( ON_NurbsCurve& curve, 
                                double tolerance,
                                const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                                ) const
{
  int rc = 1;

  // 4 May 2007 Dale Lear
  //   I'm replacing the call to operator= with a call to
  //   Internal_DeepCopyFrom().  The operator= call
  //   was copying userdata and that does not happen for
  //   any other GetNurbForm overrides.  Copying userdata
  //   in GetNurbForm is causing trouble in Make2D and 
  //   other places that are creating NURBS copies in
  //   worker memory pools.

  // curve = *this; // copied user data

  curve.DestroyRuntimeCache(true);
  if (this != &curve)
  {
    curve.Internal_DeepCopyFrom(*this); // does not copy user data
  }

  if ( subdomain ) 
  {
    if ( !curve.Trim(*subdomain) )
      rc = 0;
  }
  return rc;
}